

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::reallocate
          (QMovableArrayOps<std::pair<double,_QVariant>_> *this,qsizetype alloc,
          AllocationOption option)

{
  pair<QArrayData_*,_void_*> pVar1;
  
  pVar1 = QArrayData::reallocateUnaligned
                    (&((this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                       super_QArrayDataPointer<std::pair<double,_QVariant>_>.d)->super_QArrayData,
                     (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                     super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr,0x28,alloc,option);
  if (pVar1.second != (void *)0x0) {
    (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
    super_QArrayDataPointer<std::pair<double,_QVariant>_>.d = (Data *)pVar1.first;
    (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
    super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr =
         (pair<double,_QVariant> *)pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }